

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,false,false>
               (timestamp_t *ldata,interval_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  timestamp_t tVar4;
  ulong uVar5;
  timestamp_t *extraout_RDX;
  timestamp_t *extraout_RDX_00;
  timestamp_t *ptVar6;
  timestamp_t *extraout_RDX_01;
  ulong uVar7;
  int64_t *piVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  interval_t iVar12;
  interval_t interval;
  interval_t interval_00;
  int64_t *local_78;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = &rdata->micros;
      iVar9 = 0;
      ptVar6 = result_data;
      do {
        tVar4.value = ldata[iVar9].value;
        iVar12.micros = (int64_t)ptVar6;
        iVar12._0_8_ = *local_78;
        iVar12 = Interval::Invert(*(Interval **)(local_78 + -1),iVar12);
        tVar4 = Interval::Add(tVar4,iVar12);
        result_data[iVar9].value = tVar4.value;
        iVar9 = iVar9 + 1;
        local_78 = local_78 + 2;
        ptVar6 = extraout_RDX_01;
      } while (count != iVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar7 = 0;
    uVar5 = 0;
    ptVar6 = result_data;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar11 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar11 = count;
        }
LAB_0099118d:
        uVar3 = uVar7;
        if (uVar7 < uVar11) {
          piVar8 = &rdata[uVar7].micros;
          do {
            tVar4.value = ldata[uVar7].value;
            interval.micros = (int64_t)ptVar6;
            interval._0_8_ = *piVar8;
            iVar12 = Interval::Invert(*(Interval **)(piVar8 + -1),interval);
            tVar4 = Interval::Add(tVar4,iVar12);
            result_data[uVar7].value = tVar4.value;
            uVar7 = uVar7 + 1;
            piVar8 = piVar8 + 2;
            ptVar6 = extraout_RDX;
            uVar3 = uVar11;
          } while (uVar11 != uVar7);
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar11 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar11 = count;
        }
        uVar3 = uVar11;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_0099118d;
          uVar3 = uVar7;
          if (uVar7 < uVar11) {
            piVar8 = &rdata[uVar7].micros;
            uVar10 = 0;
            do {
              if ((uVar2 >> (uVar10 & 0x3f) & 1) != 0) {
                tVar4.value = ldata[uVar7 + uVar10].value;
                interval_00.micros = (int64_t)ptVar6;
                interval_00._0_8_ = *piVar8;
                iVar12 = Interval::Invert(*(Interval **)(piVar8 + -1),interval_00);
                tVar4 = Interval::Add(tVar4,iVar12);
                result_data[uVar7 + uVar10].value = tVar4.value;
                ptVar6 = extraout_RDX_00;
              }
              uVar10 = uVar10 + 1;
              piVar8 = piVar8 + 2;
              uVar3 = uVar11;
            } while (uVar11 - uVar7 != uVar10);
          }
        }
      }
      uVar7 = uVar3;
      uVar5 = uVar5 + 1;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}